

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O0

char * parse_escape(dmr_C *C,char *p,uint *val,char *end,int bits,position pos)

{
  uint uVar1;
  bool bVar2;
  uint local_48;
  uint local_44;
  uint mask;
  uint d;
  uint c;
  int bits_local;
  char *end_local;
  uint *val_local;
  char *p_local;
  dmr_C *C_local;
  position pos_local;
  
  pos_local = (position)((long)p + 1);
  if ((int)*p == 0x5c) {
    val_local = (uint *)(p + 2);
    mask = (uint)*(char *)pos_local;
    switch(mask) {
    case 0x22:
    case 0x27:
    case 0x3f:
    case 0x5c:
      break;
    default:
      dmrC_warning(C,pos,"unknown escape sequence: \'\\%c\'",(ulong)mask);
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
      _c = (uint *)end;
      if (p + 4 < end) {
        _c = (uint *)(p + 4);
      }
      mask = mask - 0x30;
      while( true ) {
        bVar2 = false;
        if (val_local < _c) {
          local_44 = (int)(char)*val_local - 0x30;
          bVar2 = local_44 < 8;
        }
        if (!bVar2) break;
        mask = mask * 8 + local_44;
        val_local = (uint *)((long)val_local + 1);
      }
      if (((mask & 0x100) != 0) && (bits < 9)) {
        dmrC_warning(C,pos,"octal escape sequence out of range");
      }
      break;
    case 0x61:
      mask = 7;
      break;
    case 0x62:
      mask = 8;
      break;
    case 0x65:
      mask = 0x1b;
      break;
    case 0x66:
      mask = 0xc;
      break;
    case 0x6e:
      mask = 10;
      break;
    case 0x72:
      mask = 0xd;
      break;
    case 0x74:
      mask = 9;
      break;
    case 0x76:
      mask = 0xb;
      break;
    case 0x78:
      local_48 = -(1 << ((char)bits - 4U & 0x1f));
      mask = 0;
      while ((val_local < end && (uVar1 = dmrC_hexval((int)(char)*val_local), uVar1 < 0x11))) {
        val_local = (uint *)((long)val_local + 1);
        if ((mask & local_48) != 0) {
          dmrC_warning(C,pos,"hex escape sequence out of range");
          local_48 = 0;
        }
        mask = mask * 0x10 + uVar1;
      }
    }
    *val = mask & ((-1 << ((char)bits - 1U & 0x1f)) << 1 ^ 0xffffffffU);
    pos_local = (position)val_local;
  }
  else {
    *val = (int)*p;
  }
  return (char *)pos_local;
}

Assistant:

static const char *parse_escape(struct dmr_C *C, const char *p, unsigned *val, const char *end, int bits, struct position pos)
{
	unsigned c = *p++;
	unsigned d;
	if (c != '\\') {
		*val = c;
		return p;
	}

	c = *p++;
	switch (c) {
	case 'a': c = '\a'; break;
	case 'b': c = '\b'; break;
	case 't': c = '\t'; break;
	case 'n': c = '\n'; break;
	case 'v': c = '\v'; break;
	case 'f': c = '\f'; break;
	case 'r': c = '\r'; break;
#ifndef _MSC_VER
	case 'e': c = '\e'; break;
#endif
	case 'x': {
		unsigned mask = -(1U << (bits - 4));
		for (c = 0; p < end; c = (c << 4) + d) {
			d = dmrC_hexval(*p);
			if (d > 16)
				break;
			p++;
			if (c & mask) {
				dmrC_warning(C, pos,
					"hex escape sequence out of range");
				mask = 0;
			}
		}
		break;
	}
	case '0':case '1': case '2': case '3': case '4': case '5':
	case '6': case '7': {
		if (p + 2 < end)
			end = p + 2;
		c -= '0';
		while (p < end && (d = *p - '0') < 8) {
			c = (c << 3) + d;
			p++;
		}
		if ((c & 0400) && bits < 9)
			dmrC_warning(C, pos,
				"octal escape sequence out of range");
		break;
	}
	default:	/* everything else is left as is */
		dmrC_warning(C, pos, "unknown escape sequence: '\\%c'", c);
		break;
	case '\\':
	case '\'':
	case '"':
	case '?':
		break;	/* those are legal, so no warnings */
	}
	*val = c & ~((~0U << (bits - 1)) << 1);
	return p;
}